

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::Monomorphize::updateCall
          (Monomorphize *this,CallInfo *info,Name newTarget,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *newOperands,Module *wasm)

{
  bool bVar1;
  Type local_48;
  BasicType local_3c;
  Module *local_38;
  Module *wasm_local;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *newOperands_local;
  CallInfo *info_local;
  Monomorphize *this_local;
  Name newTarget_local;
  
  newTarget_local.super_IString.str._M_len = newTarget.super_IString.str._M_str;
  this_local = newTarget.super_IString.str._M_len;
  local_38 = wasm;
  wasm_local = (Module *)newOperands;
  newOperands_local = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)info;
  info_local = (CallInfo *)this;
  wasm::Name::operator=(&info->call->target,(Name *)&this_local);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
             ((newOperands_local->
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
              super__Vector_impl_data._M_start + 2),
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)wasm_local);
  if ((newOperands_local->
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    local_3c = unreachable;
    bVar1 = wasm::Type::operator!=
                      ((Type *)((newOperands_local->
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1),&local_3c);
    if (!bVar1) {
      __assert_fail("info.call->type != Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                    ,0x38d,
                    "void wasm::(anonymous namespace)::Monomorphize::updateCall(const CallInfo &, Name, const std::vector<Expression *> &, Module &)"
                   );
    }
    wasm::Type::Type(&local_48,none);
    (newOperands_local->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
    ._M_impl.super__Vector_impl_data._M_start[1] = (Expression *)local_48.id;
    *(newOperands_local->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
     )._M_impl.super__Vector_impl_data._M_finish =
         (Expression *)
         (newOperands_local->
         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void updateCall(const CallInfo& info,
                  Name newTarget,
                  const std::vector<Expression*>& newOperands,
                  Module& wasm) {
    info.call->target = newTarget;
    info.call->operands.set(newOperands);

    if (info.drop) {
      // Replace (drop (call)) with (call), that is, replace the drop with the
      // (updated) call which now has type none. Note we should have handled
      // unreachability before getting here.
      assert(info.call->type != Type::unreachable);
      info.call->type = Type::none;
      *info.drop = info.call;
    }
  }